

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReconv.c
# Opt level: O2

Vec_Ptr_t *
Abc_NodeCollectTfoCands(Abc_ManCut_t *p,Abc_Obj_t *pRoot,Vec_Ptr_t *vLeaves,int LevelMax)

{
  void **ppvVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Obj_t *p_00;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  ulong uVar5;
  Abc_Obj_t *pAVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  uint Level;
  Vec_Vec_t *pVVar10;
  long lVar11;
  uint local_38;
  
  pAVar2 = pRoot->pNtk;
  if (pAVar2->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcReconv.c"
                  ,0x2c1,
                  "Vec_Ptr_t *Abc_NodeCollectTfoCands(Abc_ManCut_t *, Abc_Obj_t *, Vec_Ptr_t *, int)"
                 );
  }
  iVar8 = 0;
  while (iVar8 < p->vLevels->nSize) {
    pVVar4 = Vec_VecEntry(p->vLevels,iVar8);
    iVar8 = iVar8 + 1;
    if (pVVar4->nSize != 0) {
      __assert_fail("vVec->nSize == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcReconv.c"
                    ,0x2c5,
                    "Vec_Ptr_t *Abc_NodeCollectTfoCands(Abc_ManCut_t *, Abc_Obj_t *, Vec_Ptr_t *, int)"
                   );
    }
  }
  if ((pAVar2->vTravIds).pArray == (int *)0x0) {
    uVar9 = pAVar2->vObjs->nSize + 500;
    Vec_IntGrow(&pAVar2->vTravIds,uVar9);
    uVar5 = 0;
    uVar7 = 0;
    if (0 < (int)uVar9) {
      uVar7 = (ulong)uVar9;
    }
    for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      (pAVar2->vTravIds).pArray[uVar5] = 0;
    }
    (pAVar2->vTravIds).nSize = uVar9;
  }
  iVar8 = pAVar2->nTravIds;
  pAVar2->nTravIds = iVar8 + 1;
  if (0x3ffffffe < iVar8) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  local_38 = 0xffffffff;
  for (iVar8 = 0; iVar8 < vLeaves->nSize; iVar8 = iVar8 + 1) {
    pAVar6 = (Abc_Obj_t *)Vec_PtrEntry(vLeaves,iVar8);
    if (*(uint *)&pAVar6->field_0x14 >> 0xc <= (uint)LevelMax) {
      Abc_NodeSetTravIdCurrent(pAVar6);
      Vec_VecPush(p->vLevels,*(uint *)&pAVar6->field_0x14 >> 0xc,pAVar6);
      uVar9 = *(uint *)&pAVar6->field_0x14 >> 0xc;
      if ((int)local_38 <= (int)uVar9) {
        local_38 = uVar9;
      }
    }
  }
  if ((int)local_38 < 0) {
    __assert_fail("LevelMin >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcReconv.c"
                  ,0x2d3,
                  "Vec_Ptr_t *Abc_NodeCollectTfoCands(Abc_ManCut_t *, Abc_Obj_t *, Vec_Ptr_t *, int)"
                 );
  }
  Abc_NodeMffcLabelAig(pRoot);
  p->vNodesTfo->nSize = 0;
  uVar9 = local_38;
  do {
    pVVar10 = p->vLevels;
    iVar8 = pVVar10->nSize;
    if (iVar8 <= (int)uVar9) {
      for (; ((int)local_38 < iVar8 &&
             (pVVar4 = Vec_VecEntry(pVVar10,local_38), (int)local_38 <= LevelMax));
          local_38 = local_38 + 1) {
        pVVar4->nSize = 0;
        pVVar10 = p->vLevels;
        iVar8 = pVVar10->nSize;
      }
      return p->vNodesTfo;
    }
    for (iVar8 = 0; pVVar4 = Vec_VecEntry(pVVar10,uVar9), iVar8 < pVVar4->nSize; iVar8 = iVar8 + 1)
    {
      pVVar4 = Vec_VecEntry(p->vLevels,uVar9);
      pAVar6 = (Abc_Obj_t *)Vec_PtrEntry(pVVar4,iVar8);
      if (LevelMax < (int)uVar9) break;
      iVar3 = Abc_NodeIsTravIdCurrent(pAVar6);
      if (iVar3 == 0) {
        iVar3 = Abc_NodeIsTravIdCurrent
                          ((Abc_Obj_t *)pAVar6->pNtk->vObjs->pArray[*(pAVar6->vFanins).pArray]);
        if ((iVar3 != 0) &&
           (iVar3 = Abc_NodeIsTravIdCurrent
                              ((Abc_Obj_t *)pAVar6->pNtk->vObjs->pArray[(pAVar6->vFanins).pArray[1]]
                              ), iVar3 != 0)) {
          Vec_PtrPush(p->vNodesTfo,pAVar6);
          Abc_NodeSetTravIdCurrent(pAVar6);
          goto LAB_002b1d9d;
        }
      }
      else {
LAB_002b1d9d:
        for (lVar11 = 0; lVar11 < (pAVar6->vFanouts).nSize; lVar11 = lVar11 + 1) {
          p_00 = (Abc_Obj_t *)pAVar6->pNtk->vObjs->pArray[(pAVar6->vFanouts).pArray[lVar11]];
          if (((*(uint *)&p_00->field_0x14 >> 0xc <= (uint)LevelMax) &&
              (1 < (*(uint *)&p_00->field_0x14 & 0xf) - 3)) &&
             (iVar3 = Abc_NodeIsTravIdCurrent(p_00), iVar3 == 0)) {
            pVVar10 = p->vLevels;
            Level = *(uint *)&p_00->field_0x14 >> 0xc;
            if ((int)Level < pVVar10->nSize) {
              pVVar4 = Vec_VecEntry(pVVar10,Level);
              uVar5 = (ulong)(uint)pVVar4->nSize;
              if (pVVar4->nSize < 1) {
                uVar5 = 0;
              }
              uVar7 = 0;
              do {
                if (uVar5 == uVar7) {
                  Vec_PtrPush(pVVar4,p_00);
                  break;
                }
                ppvVar1 = pVVar4->pArray + uVar7;
                uVar7 = uVar7 + 1;
              } while ((Abc_Obj_t *)*ppvVar1 != p_00);
            }
            else {
              Vec_VecPush(pVVar10,Level,p_00);
            }
          }
        }
      }
      pVVar10 = p->vLevels;
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

Vec_Ptr_t * Abc_NodeCollectTfoCands( Abc_ManCut_t * p, Abc_Obj_t * pRoot, Vec_Ptr_t * vLeaves, int LevelMax )
{
    Abc_Ntk_t * pNtk = pRoot->pNtk;
    Vec_Ptr_t * vVec;
    Abc_Obj_t * pNode, * pFanout;
    int i, k, v, LevelMin;
    assert( Abc_NtkIsStrash(pNtk) );

    // assuming that the structure is clean
    Vec_VecForEachLevel( p->vLevels, vVec, i )
        assert( vVec->nSize == 0 );

    // put fanins into the structure while labeling them
    Abc_NtkIncrementTravId( pNtk );
    LevelMin = -1;
    Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pNode, i )
    {
        if ( pNode->Level > (unsigned)LevelMax )
            continue;
        Abc_NodeSetTravIdCurrent( pNode );
        Vec_VecPush( p->vLevels, pNode->Level, pNode );
        if ( LevelMin < (int)pNode->Level )
            LevelMin = pNode->Level;
    }
    assert( LevelMin >= 0 );

    // mark MFFC 
    if ( pRoot )
        Abc_NodeMffcLabelAig( pRoot );

    // go through the levels up
    Vec_PtrClear( p->vNodesTfo );
    Vec_VecForEachEntryStart( Abc_Obj_t *, p->vLevels, pNode, i, k, LevelMin )
    {
        if ( i > LevelMax )
            break;
        // if the node is not marked, it is not a fanin
        if ( !Abc_NodeIsTravIdCurrent(pNode) )
        {
            // check if it belongs to the TFO
            if ( !Abc_NodeIsTravIdCurrent(Abc_ObjFanin0(pNode)) || 
                 !Abc_NodeIsTravIdCurrent(Abc_ObjFanin1(pNode)) )
                 continue;
            // save the node in the TFO and label it
            Vec_PtrPush( p->vNodesTfo, pNode );
            Abc_NodeSetTravIdCurrent( pNode );
        }
        // go through the fanouts and add them to the structure if they meet the conditions
        Abc_ObjForEachFanout( pNode, pFanout, v )
        {
            // skip if fanout is a CO or its level exceeds
            if ( Abc_ObjIsCo(pFanout) || pFanout->Level > (unsigned)LevelMax )
                continue;
            // skip if it is already added or if it is in MFFC
            if ( Abc_NodeIsTravIdCurrent(pFanout) )
                continue;
            // add it to the structure but do not mark it (until tested later)
            Vec_VecPushUnique( p->vLevels, pFanout->Level, pFanout );
        }
    }

    // clear the levelized structure
    Vec_VecForEachLevelStart( p->vLevels, vVec, i, LevelMin )
    {
        if ( i > LevelMax )
            break;
        Vec_PtrClear( vVec );
    }
    return p->vNodesTfo;
}